

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

int32_t utrie_serialize_63(UNewTrie *trie,void *dt,int32_t capacity,
                          UNewTrieGetFoldedValue *getFoldedValue,UBool reduceTo16Bits,
                          UErrorCode *pErrorCode)

{
  int iVar1;
  int32_t *piVar2;
  uint32_t *puVar3;
  UBool UVar4;
  uint32_t value;
  uint32_t uVar5;
  int iVar6;
  code *pcVar7;
  int32_t *piVar8;
  int iVar9;
  uint uVar10;
  UNewTrie *pUVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  undefined2 *puVar15;
  int32_t *piVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int32_t iVar20;
  byte bVar21;
  int32_t local_b8 [34];
  
  bVar21 = 0;
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if ((capacity < 0 || trie == (UNewTrie *)0x0) || (dt == (void *)0x0 && capacity != 0)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  if (trie->isCompacted != '\0') goto LAB_001c3431;
  pcVar7 = defaultGetFoldedValue;
  if (getFoldedValue != (UNewTrieGetFoldedValue *)0x0) {
    pcVar7 = getFoldedValue;
  }
  iVar20 = 0;
  utrie_compact(trie,'\0',pErrorCode);
  piVar8 = trie->index + 0x6c0;
  piVar16 = local_b8;
  for (lVar12 = 0x20; lVar12 != 0; lVar12 = lVar12 + -1) {
    *piVar16 = *piVar8;
    piVar8 = piVar8 + (ulong)bVar21 * -2 + 1;
    piVar16 = piVar16 + (ulong)bVar21 * -2 + 1;
  }
  puVar3 = trie->data;
  if (trie->leadUnitValue == *puVar3) {
LAB_001c34f8:
    for (lVar12 = 0x6c0; lVar12 != 0x6e0; lVar12 = lVar12 + 1) {
      trie->index[lVar12] = iVar20;
    }
    uVar17 = 0x800;
    uVar10 = 0x10000;
    while (iVar6 = (int)uVar17, (int)uVar10 < 0x110000) {
      if (trie->index[(int)uVar10 >> 5] == 0) {
        uVar10 = uVar10 + 0x20;
      }
      else {
        uVar14 = uVar10 & 0xfffffc00;
        piVar8 = trie->index + 0x800;
        for (uVar18 = 0x800; uVar19 = uVar17, (long)uVar18 < (long)iVar6; uVar18 = uVar18 + 0x20) {
          lVar12 = 0;
          do {
            uVar19 = uVar18;
            if (lVar12 == 0x20) goto LAB_001c361f;
            piVar16 = piVar8 + lVar12;
            piVar2 = trie->index + ((int)uVar14 >> 5) + lVar12;
            lVar12 = lVar12 + 1;
          } while (*piVar16 == *piVar2);
          piVar8 = piVar8 + 0x20;
        }
LAB_001c361f:
        value = (*pcVar7)(trie,uVar14,(int)uVar19 + 0x20);
        uVar10 = (uVar10 >> 10) + 0xd7c0 & 0xffff;
        uVar5 = utrie_get32_63(trie,uVar10,(UBool *)0x0);
        if (value != uVar5) {
          UVar4 = utrie_set32_63(trie,uVar10,value);
          if (UVar4 == '\0') {
            *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
            goto LAB_001c3761;
          }
          if ((int)uVar19 == iVar6) {
            memmove(trie->index + iVar6,trie->index + ((int)uVar14 >> 5),0x80);
            uVar17 = (ulong)(iVar6 + 0x20);
          }
        }
        uVar10 = uVar14 + 0x400;
      }
    }
    if (iVar6 < 0x8800) {
      memmove(trie->index + 0x820,trie->index + 0x800,(long)(iVar6 * 4 + -0x2000));
      piVar8 = local_b8;
      piVar16 = trie->index + 0x800;
      for (lVar12 = 0x20; lVar12 != 0; lVar12 = lVar12 + -1) {
        *piVar16 = *piVar8;
        piVar8 = piVar8 + (ulong)bVar21 * -2 + 1;
        piVar16 = piVar16 + (ulong)bVar21 * -2 + 1;
      }
      trie->indexLength = iVar6 + 0x20;
    }
    else {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
  }
  else {
    uVar10 = trie->dataLength;
    if (((int)(uVar10 + 0x20) <= trie->dataCapacity) &&
       (trie->dataLength = uVar10 + 0x20, -1 < (int)uVar10)) {
      utrie_fillBlock(puVar3 + uVar10,0,0x20,trie->leadUnitValue,*puVar3,'\x01');
      iVar20 = -uVar10;
      goto LAB_001c34f8;
    }
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
LAB_001c3761:
  utrie_compact(trie,'\x01',pErrorCode);
  trie->isCompacted = '\x01';
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
LAB_001c3431:
  iVar6 = trie->dataLength;
  iVar9 = iVar6;
  if (reduceTo16Bits != '\0') {
    iVar9 = trie->indexLength + iVar6;
  }
  if (0x3ffff < iVar9) {
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  iVar9 = trie->indexLength;
  if (reduceTo16Bits == '\0') {
    iVar1 = iVar6 * 4 + iVar9 * 2;
  }
  else {
    iVar1 = (iVar6 + iVar9) * 2;
  }
  if (iVar1 + 0x10 <= capacity) {
    *(undefined4 *)dt = 0x54726965;
    uVar10 = (uint)(reduceTo16Bits == '\0') << 8;
    *(uint *)((long)dt + 4) = uVar10 | 0x25;
    if (trie->isLatin1Linear != '\0') {
      *(uint *)((long)dt + 4) = uVar10 | 0x225;
    }
    puVar15 = (undefined2 *)((long)dt + 0x10);
    *(int *)((long)dt + 8) = iVar9;
    *(int *)((long)dt + 0xc) = iVar6;
    pUVar11 = trie;
    iVar13 = iVar9;
    if (reduceTo16Bits == '\0') {
      lVar12 = 0;
      for (; 0 < iVar9; iVar9 = iVar9 + -1) {
        *(short *)((long)puVar15 + lVar12) = (short)(*(uint *)((long)trie->index + lVar12 * 2) >> 2)
        ;
        lVar12 = lVar12 + 2;
      }
      memcpy((void *)((long)puVar15 + lVar12),trie->data,(long)iVar6 << 2);
    }
    else {
      for (; 0 < iVar13; iVar13 = iVar13 + -1) {
        *puVar15 = (short)((uint)(pUVar11->index[0] + iVar9) >> 2);
        puVar15 = puVar15 + 1;
        pUVar11 = (UNewTrie *)(pUVar11->index + 1);
      }
      puVar3 = trie->data;
      lVar12 = 0;
      for (; 0 < iVar6; iVar6 = iVar6 + -1) {
        *(undefined2 *)((long)puVar15 + lVar12) = *(undefined2 *)((long)puVar3 + lVar12 * 2);
        lVar12 = lVar12 + 2;
      }
    }
  }
  return iVar1 + 0x10;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie_serialize(UNewTrie *trie, void *dt, int32_t capacity,
                UNewTrieGetFoldedValue *getFoldedValue,
                UBool reduceTo16Bits,
                UErrorCode *pErrorCode) {
    UTrieHeader *header;
    uint32_t *p;
    uint16_t *dest16;
    int32_t i, length;
    uint8_t* data = NULL;

    /* argument check */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if(trie==NULL || capacity<0 || (capacity>0 && dt==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(getFoldedValue==NULL) {
        getFoldedValue=defaultGetFoldedValue;
    }

    data = (uint8_t*)dt;
    /* fold and compact if necessary, also checks that indexLength is within limits */
    if(!trie->isCompacted) {
        /* compact once without overlap to improve folding */
        utrie_compact(trie, FALSE, pErrorCode);

        /* fold the supplementary part of the index array */
        utrie_fold(trie, getFoldedValue, pErrorCode);

        /* compact again with overlap for minimum data array length */
        utrie_compact(trie, TRUE, pErrorCode);

        trie->isCompacted=TRUE;
        if(U_FAILURE(*pErrorCode)) {
            return 0;
        }
    }

    /* is dataLength within limits? */
    if( (reduceTo16Bits ? (trie->dataLength+trie->indexLength) : trie->dataLength) >= UTRIE_MAX_DATA_LENGTH) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
    }

    length=sizeof(UTrieHeader)+2*trie->indexLength;
    if(reduceTo16Bits) {
        length+=2*trie->dataLength;
    } else {
        length+=4*trie->dataLength;
    }

    if(length>capacity) {
        return length; /* preflighting */
    }

#ifdef UTRIE_DEBUG
    printf("**UTrieLengths(serialize)** index:%6ld  data:%6ld  serialized:%6ld\n",
           (long)trie->indexLength, (long)trie->dataLength, (long)length);
#endif

    /* set the header fields */
    header=(UTrieHeader *)data;
    data+=sizeof(UTrieHeader);

    header->signature=0x54726965; /* "Trie" */
    header->options=UTRIE_SHIFT | (UTRIE_INDEX_SHIFT<<UTRIE_OPTIONS_INDEX_SHIFT);

    if(!reduceTo16Bits) {
        header->options|=UTRIE_OPTIONS_DATA_IS_32_BIT;
    }
    if(trie->isLatin1Linear) {
        header->options|=UTRIE_OPTIONS_LATIN1_IS_LINEAR;
    }

    header->indexLength=trie->indexLength;
    header->dataLength=trie->dataLength;

    /* write the index (stage 1) array and the 16/32-bit data (stage 2) array */
    if(reduceTo16Bits) {
        /* write 16-bit index values shifted right by UTRIE_INDEX_SHIFT, after adding indexLength */
        p=(uint32_t *)trie->index;
        dest16=(uint16_t *)data;
        for(i=trie->indexLength; i>0; --i) {
            *dest16++=(uint16_t)((*p++ + trie->indexLength)>>UTRIE_INDEX_SHIFT);
        }

        /* write 16-bit data values */
        p=trie->data;
        for(i=trie->dataLength; i>0; --i) {
            *dest16++=(uint16_t)*p++;
        }
    } else {
        /* write 16-bit index values shifted right by UTRIE_INDEX_SHIFT */
        p=(uint32_t *)trie->index;
        dest16=(uint16_t *)data;
        for(i=trie->indexLength; i>0; --i) {
            *dest16++=(uint16_t)(*p++ >> UTRIE_INDEX_SHIFT);
        }

        /* write 32-bit data values */
        uprv_memcpy(dest16, trie->data, 4*(size_t)trie->dataLength);
    }

    return length;
}